

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O2

void cs_debugger_step_callback(statement_base *stmt)

{
  pointer puVar1;
  ulong line_num;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  size_t sVar5;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::csym_info>_>
  pcVar6;
  ostream *poVar7;
  
  psVar4 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
  bVar3 = std::operator!=(psVar4,&path_abi_cxx11_);
  if (!bVar3) {
    sVar5 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                        *)&(((context.
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->compiler).
                            super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->csyms,&path_abi_cxx11_);
    if (sVar5 == 0) {
      if ((exec_by_step == false) &&
         (bVar3 = breakpoint_recorder::exist(&breakpoints,stmt->line_num), bVar3)) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
        psVar4 = cs::statement_base::get_file_path_abi_cxx11_(stmt);
        poVar7 = std::operator<<(poVar7,(string *)psVar4);
        poVar7 = std::operator<<(poVar7,"\", line ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        current_level =
             *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
        exec_by_step = true;
      }
      else if ((exec_by_step & 1U) == 0) {
        return;
      }
      if ((step_into_function != false) ||
         ((ulong)(*(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3
                 ) <= current_level)) {
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar7 = std::operator<<(poVar7,"\t");
        psVar4 = cs::statement_base::get_raw_code_abi_cxx11_(stmt);
        poVar7 = std::operator<<(poVar7,(string *)psVar4);
        std::endl<char,std::char_traits<char>>(poVar7);
        current_level =
             *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
        step_into_function = false;
        do {
          bVar3 = covscript_debugger();
        } while (bVar3);
      }
    }
    else {
      pcVar6 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
               ::
               operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                           *)&(((context.
                                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->compiler).
                               super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->csyms,&path_abi_cxx11_);
      puVar1 = (pcVar6->map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((stmt->line_num <
            (ulong)((long)(pcVar6->map).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
          (line_num = puVar1[stmt->line_num - 1], line_num != 0)) &&
         (pbVar2 = (pcVar6->codes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         line_num <
         (ulong)((long)(pcVar6->codes).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5))) {
        if ((exec_by_step == false) &&
           (bVar3 = breakpoint_recorder::exist(&breakpoints,line_num), bVar3)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
          poVar7 = std::operator<<(poVar7,(string *)pcVar6);
          poVar7 = std::operator<<(poVar7,"\", line ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::endl<char,std::char_traits<char>>(poVar7);
          current_level =
               *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
          exec_by_step = true;
        }
        else if ((exec_by_step & 1U) == 0) {
          return;
        }
        if ((step_into_function != false) ||
           ((ulong)(*(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >>
                   3) <= current_level)) {
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          poVar7 = std::operator<<(poVar7,"\t");
          poVar7 = std::operator<<(poVar7,(string *)(pbVar2 + (line_num - 1)));
          std::endl<char,std::char_traits<char>>(poVar7);
          current_level =
               *(long *)(cs::current_process + 0x88) - *(long *)(cs::current_process + 0x80) >> 3;
          step_into_function = false;
          do {
            bVar3 = covscript_debugger();
          } while (bVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void cs_debugger_step_callback(cs::statement_base *stmt)
{
	if (stmt->get_file_path() != path)
		return;
	if (context->compiler->csyms.count(path) > 0) {
		cs::csym_info &csym = context->compiler->csyms[path];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		const std::string &code = csym.codes[actual_line - 1];
		if (!exec_by_step && breakpoints.exist(actual_line)) {
			std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << actual_line << "\t" << code << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
	else {
		if (!exec_by_step && breakpoints.exist(stmt->get_line_num())) {
			std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num()
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << stmt->get_line_num() << "\t" << stmt->get_raw_code() << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
}